

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayFill
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayFill *curr,
          optional<wasm::HeapType> ht)

{
  bool bVar1;
  HeapType *pHVar2;
  Type local_70;
  uintptr_t local_68;
  Type local_60;
  uintptr_t local_58;
  Type local_50;
  HeapType local_48 [2];
  Type local_38;
  Type type;
  ArrayFill *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ht_local;
  
  this_local = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    type.id = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&this_local,(HeapType *)&type);
  }
  std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  HeapType::getArray(local_48);
  local_38.id = local_48[0].id;
  pHVar2 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
  local_58 = pHVar2->id;
  wasm::Type::Type(&local_50,(HeapType)local_58,Nullable,Inexact);
  note(this,&curr->ref,local_50);
  wasm::Type::Type(&local_60,i32);
  note(this,&curr->index,local_60);
  local_68 = local_38.id;
  note(this,&curr->value,local_38);
  wasm::Type::Type(&local_70,i32);
  note(this,&curr->size,local_70);
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr,
                      std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    auto type = ht->getArray().element.type;
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->index, Type::i32);
    note(&curr->value, type);
    note(&curr->size, Type::i32);
  }